

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  bool bVar1;
  long lVar2;
  undefined8 in_RSI;
  bad_cast *anon_var_0;
  Dispatch_Function *dispatch_fun;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_ffffffffffffffc8;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_ffffffffffffffd0;
  
  lVar2 = __dynamic_cast(in_RSI,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  bVar1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

virtual bool operator==(const dispatch::Proxy_Function_Base &rhs) const CHAISCRIPT_OVERRIDE
        {
          try {
            const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
            return m_funcs == dispatch_fun.m_funcs;
          } catch (const std::bad_cast &) {
            return false;
          }
        }